

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
math::wide_integer::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          uintwide_t<24U,_unsigned_char,_void,_false> *x)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  uint uVar2;
  long lVar3;
  unsigned_fast_type field_width;
  basic_ostream<char,_std::char_traits<char>_> fill_char_str;
  size_t sVar4;
  ostream *poVar5;
  uint_fast8_t base_rep;
  char *local_1c8;
  undefined5 uStack_1c0;
  undefined1 uStack_1bb;
  undefined2 uStack_1ba;
  undefined5 uStack_1b8;
  undefined1 uStack_1b3;
  undefined2 uStack_1b2;
  undefined5 uStack_1b0;
  undefined1 uStack_1ab;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ostr;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  lVar3 = *(long *)(*(long *)out + -0x18);
  uVar2 = *(uint *)(out + lVar3 + 0x18);
  base_rep = '\x10';
  if ((uVar2 & 8) == 0) {
    base_rep = '\n';
  }
  pbVar1 = out + lVar3;
  field_width = *(unsigned_fast_type *)(out + lVar3 + 0x10);
  if (out[lVar3 + 0xe1] == (basic_ostream<char,_std::char_traits<char>_>)0x1) {
    fill_char_str = pbVar1[0xe0];
  }
  else {
    fill_char_str = (basic_ostream<char,_std::char_traits<char>_>)std::ios::widen((char)pbVar1);
    pbVar1[0xe0] = fill_char_str;
    pbVar1[0xe1] = (basic_ostream<char,_std::char_traits<char>_>)0x1;
  }
  if ((uVar2 & 0x40) == 0) {
    if ((uVar2 & 0x48) == 8) {
      local_1c8 = (char *)0x0;
      uStack_1c0 = 0;
      uStack_1bb = 0;
      uStack_1ba = 0;
      uStack_1b8 = 0;
      uStack_1b3 = 0;
      uStack_1b2 = 0;
      uintwide_t<64u,unsigned_int,void,false>::wr_string<char*>
                ((uintwide_t<64u,unsigned_int,void,false> *)x,(char *)&local_1c8,base_rep,
                 (bool)((byte)(uVar2 >> 9) & 1),(bool)((byte)(uVar2 >> 0xb) & 1),
                 (bool)((byte)(uVar2 >> 0xe) & 1),field_width,(char)fill_char_str);
      sVar4 = strlen((char *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ostr,(char *)&local_1c8,sVar4);
    }
    else if ((uVar2 & 0x48) == 0) {
      uStack_1b8 = 0;
      uStack_1b3 = 0;
      uStack_1b2 = 0;
      uStack_1b0 = 0;
      local_1c8 = (char *)0x0;
      uStack_1c0 = 0;
      uStack_1bb = 0;
      uStack_1ba = 0;
      uintwide_t<64u,unsigned_int,void,false>::wr_string<char*>
                ((uintwide_t<64u,unsigned_int,void,false> *)x,(char *)&local_1c8,base_rep,
                 (bool)((byte)(uVar2 >> 9) & 1),(bool)((byte)(uVar2 >> 0xb) & 1),
                 (bool)((byte)(uVar2 >> 0xe) & 1),field_width,(char)fill_char_str);
      sVar4 = strlen((char *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ostr,(char *)&local_1c8,sVar4);
    }
  }
  else {
    uStack_1b8 = 0;
    uStack_1b3 = 0;
    uStack_1b2 = 0;
    uStack_1b0 = 0;
    uStack_1ab = 0;
    local_1c8 = (char *)0x0;
    uStack_1c0 = 0;
    uStack_1bb = 0;
    uStack_1ba = 0;
    uintwide_t<64u,unsigned_int,void,false>::wr_string<char*>
              ((uintwide_t<64u,unsigned_int,void,false> *)x,(char *)&local_1c8,'\b',
               (bool)((byte)(uVar2 >> 9) & 1),(bool)((byte)(uVar2 >> 0xb) & 1),
               (bool)((byte)(uVar2 >> 0xe) & 1),field_width,(char)fill_char_str);
    sVar4 = strlen((char *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ostr,(char *)&local_1c8,sVar4);
  }
  std::__cxx11::stringbuf::str();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1c8,CONCAT26(uStack_1ba,CONCAT15(uStack_1bb,uStack_1c0)));
  if (local_1c8 != (char *)&uStack_1b8) {
    operator_delete(local_1c8,CONCAT26(uStack_1b2,CONCAT15(uStack_1b3,uStack_1b8)) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  std::ios_base::~ios_base(local_138);
  return poVar5;
}

Assistant:

auto operator<<(std::basic_ostream<char_type, traits_type>& out,
                  const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> std::basic_ostream<char_type, traits_type>&
  {
    std::basic_ostringstream<char_type, traits_type> ostr;

    const std::ios::fmtflags my_flags = out.flags();

    const auto show_pos     = ((my_flags & std::ios::showpos)   == std::ios::showpos);
    const auto show_base    = ((my_flags & std::ios::showbase)  == std::ios::showbase);
    const auto is_uppercase = ((my_flags & std::ios::uppercase) == std::ios::uppercase);

    auto base_rep = std::uint_fast8_t { };

    if     ((my_flags & std::ios::oct) == std::ios::oct) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C( 8)); }
    else if((my_flags & std::ios::hex) == std::ios::hex) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(16)); }
    else                                                 { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(10)); }

    const auto field_width   = static_cast<unsigned_fast_type>(out.width());
    const auto fill_char_out = static_cast<char>(out.fill());

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;

    if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
    {
      using string_storage_oct_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_oct_type str_result { }; // LCOV_EXCL_LINE

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
    {
      using string_storage_dec_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                          std::allocator<void>,
                                                                                          AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_dec_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
    {
      using string_storage_hex_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_hex_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }

    return (out << ostr.str());
  }